

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_alter_nigel_colors.hpp
# Opt level: O3

void PatchAlterNigelColors::fix_sword_shade_frame(ROM *rom,uint32_t address,uint8_t tile_id)

{
  initializer_list<unsigned_char> __l;
  allocator_type local_32;
  uint8_t local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  __l._M_len = 1;
  __l._M_array = &local_31;
  local_31 = tile_id;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_30,__l,&local_32);
  fix_sword_shade_frame(rom,address,&local_30);
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void fix_sword_shade_frame(md::ROM& rom, uint32_t address, const uint8_t tile_id)
    {
        fix_sword_shade_frame(rom, address, std::vector<uint8_t>({tile_id}));
    }